

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O3

consume_operation * __thiscall
density::
conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>_>
::try_start_consume(consume_operation *__return_storage_ptr__,
                   conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>_>
                   *this)

{
  ulong uVar1;
  ControlBlock *pCVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  local_20._M_owns = false;
  local_20._M_device = &this->m_mutex;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  pCVar2 = (this->m_queue).m_head;
  do {
    if (pCVar2 == (this->m_queue).m_tail) {
      std::unique_lock<std::mutex>::unlock(&local_20);
      pCVar2 = (ControlBlock *)0x0;
LAB_00a8691f:
      (__return_storage_ptr__->m_lock)._M_device = local_20._M_device;
      (__return_storage_ptr__->m_lock)._M_owns = local_20._M_owns;
      local_20._M_device = (mutex_type *)0x0;
      local_20._M_owns = false;
      (__return_storage_ptr__->m_consume_operation).m_queue = &this->m_queue;
      (__return_storage_ptr__->m_consume_operation).m_control = pCVar2;
      std::unique_lock<std::mutex>::~unique_lock(&local_20);
      return __return_storage_ptr__;
    }
    uVar1 = pCVar2->m_next;
    if ((uVar1 & 3) == 0) {
      pCVar2->m_next = uVar1 | 1;
      local_20._M_owns = true;
      goto LAB_00a8691f;
    }
    pCVar2 = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
  } while( true );
}

Assistant:

consume_operation try_start_consume() noexcept
        {
            std::unique_lock<std::mutex> lock(m_mutex);
            auto                         consume = m_queue.try_start_consume();
            if (!consume)
                lock.unlock();
            return consume_operation(PrivateType(), std::move(lock), std::move(consume));
        }